

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void __thiscall CVmBigNumCache::~CVmBigNumCache(CVmBigNumCache *this)

{
  char *pcVar1;
  size_t sVar2;
  CVmBigNumCacheReg *pCVar3;
  
  sVar2 = this->max_regs_;
  if (sVar2 != 0) {
    pCVar3 = this->reg_;
    do {
      if (pCVar3->buf_ != (char *)0x0) {
        free(pCVar3->buf_);
      }
      pCVar3 = pCVar3 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  free(this->reg_);
  pcVar1 = (this->ln10_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->ln2_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->pi_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->e_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->dbl_max_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (this->dbl_min_).buf_;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    return;
  }
  return;
}

Assistant:

CVmBigNumCache::~CVmBigNumCache()
{
    CVmBigNumCacheReg *p;
    size_t i;

    /* delete each of our allocated registers */
    for (p = reg_, i = max_regs_ ; i != 0 ; ++p, --i)
        p->free_mem();

    /* free the register list array */
    t3free(reg_);

    /* free the constant value registers */
    ln10_.free_mem();
    ln2_.free_mem();
    pi_.free_mem();
    e_.free_mem();
    dbl_max_.free_mem();
    dbl_min_.free_mem();
}